

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O3

void enlarge_ntuple_list(ntuple_list n_tuple)

{
  int *piVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  undefined8 *puVar4;
  void *pvVar5;
  image_char piVar6;
  image_int piVar7;
  uint uVar8;
  uint extraout_EDX;
  int extraout_EDX_00;
  uint in_ESI;
  size_t __size;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint xsize;
  ntuple_list pnVar13;
  ntuple_list pnVar14;
  uint uVar15;
  double extraout_XMM0_Qa;
  undefined1 auVar16 [16];
  double in_XMM1_Qa;
  undefined1 auVar17 [16];
  double in_XMM2_Qa;
  undefined1 auVar18 [16];
  double in_XMM3_Qa;
  undefined4 in_XMM4_Da;
  undefined4 in_XMM4_Db;
  undefined1 auVar19 [16];
  int iVar20;
  
  pnVar14 = n_tuple;
  if (((n_tuple == (ntuple_list)0x0) ||
      (pnVar14 = (ntuple_list)n_tuple->values, pnVar14 == (ntuple_list)0x0)) ||
     (in_ESI = n_tuple->max_size, in_ESI == 0)) {
    enlarge_ntuple_list();
  }
  else {
    n_tuple->max_size = in_ESI * 2;
    __size = (ulong)(in_ESI * 2 * n_tuple->dim) << 3;
    pdVar3 = (double *)realloc(pnVar14,__size);
    in_ESI = (uint)__size;
    n_tuple->values = pdVar3;
    if (pdVar3 != (double *)0x0) {
      return;
    }
  }
  enlarge_ntuple_list();
  if (pnVar14 == (ntuple_list)0x0) {
    add_5tuple();
    pnVar13 = pnVar14;
LAB_00104134:
    add_5tuple();
  }
  else {
    pnVar13 = pnVar14;
    if (pnVar14->dim != 5) goto LAB_00104134;
    if (pnVar14->size == pnVar14->max_size) {
      enlarge_ntuple_list(pnVar14);
    }
    pdVar3 = pnVar14->values;
    if (pdVar3 != (double *)0x0) {
      uVar15 = pnVar14->size;
      uVar8 = pnVar14->dim * uVar15;
      pdVar3[uVar8] = extraout_XMM0_Qa;
      pdVar3[uVar8 + 1] = in_XMM1_Qa;
      pdVar3[uVar8 + 2] = in_XMM2_Qa;
      pdVar3[uVar8 + 3] = in_XMM3_Qa;
      pdVar3[uVar8 + 4] = (double)CONCAT44(in_XMM4_Db,in_XMM4_Da);
      pnVar14->size = uVar15 + 1;
      return;
    }
  }
  add_5tuple();
  pnVar14 = pnVar13;
  if ((pnVar13 != (ntuple_list)0x0) &&
     (pnVar14 = *(ntuple_list *)pnVar13, pnVar14 != (ntuple_list)0x0)) {
    free(pnVar14);
    free(pnVar13);
    return;
  }
  free_image_char();
  iVar11 = (int)pnVar14;
  uVar15 = in_ESI;
  if ((iVar11 == 0) || (in_ESI == 0)) {
    new_image_char();
LAB_001041b0:
    new_image_char();
  }
  else {
    pnVar14 = (ntuple_list)0x10;
    puVar4 = (undefined8 *)malloc(0x10);
    if (puVar4 == (undefined8 *)0x0) goto LAB_001041b0;
    pnVar14 = (ntuple_list)(ulong)(in_ESI * iVar11);
    uVar15 = 1;
    pvVar5 = calloc((size_t)pnVar14,1);
    *puVar4 = pvVar5;
    if (pvVar5 != (void *)0x0) {
      *(int *)(puVar4 + 1) = iVar11;
      *(uint *)((long)puVar4 + 0xc) = in_ESI;
      return;
    }
  }
  new_image_char();
  uVar12 = (uint)pnVar14;
  uVar8 = uVar15;
  piVar6 = new_image_char(uVar12,uVar15);
  if ((piVar6 != (image_char)0x0) &&
     (pnVar14 = (ntuple_list)piVar6->data, pnVar14 != (ntuple_list)0x0)) {
    uVar15 = uVar15 * uVar12;
    if (uVar15 != 0) {
      memset(pnVar14,extraout_EDX & 0xff,(ulong)uVar15);
    }
    return;
  }
  new_image_char_ini();
  pnVar13 = pnVar14;
  if ((pnVar14 != (ntuple_list)0x0) &&
     (pnVar13 = *(ntuple_list *)pnVar14, pnVar13 != (ntuple_list)0x0)) {
    free(pnVar13);
    free(pnVar14);
    return;
  }
  uVar12 = (uint)pnVar13;
  free_image_int();
  uVar15 = uVar8;
  if ((uVar12 == 0) || (uVar8 == 0)) {
    xsize = uVar12;
    new_image_int();
  }
  else {
    xsize = 0x10;
    puVar4 = (undefined8 *)malloc(0x10);
    if (puVar4 != (undefined8 *)0x0) {
      xsize = uVar8 * uVar12;
      uVar15 = 4;
      pvVar5 = calloc((ulong)xsize,4);
      *puVar4 = pvVar5;
      if (pvVar5 != (void *)0x0) {
        *(uint *)(puVar4 + 1) = uVar12;
        *(uint *)((long)puVar4 + 0xc) = uVar8;
        return;
      }
      goto LAB_0010427d;
    }
  }
  new_image_int();
LAB_0010427d:
  new_image_int();
  piVar7 = new_image_int(xsize,uVar15);
  auVar2 = _DAT_00108030;
  uVar15 = uVar15 * xsize;
  if (uVar15 != 0) {
    piVar1 = piVar7->data;
    lVar9 = (ulong)uVar15 - 1;
    auVar16._8_4_ = (int)lVar9;
    auVar16._0_8_ = lVar9;
    auVar16._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar10 = 0;
    auVar16 = auVar16 ^ _DAT_00108030;
    auVar17 = _DAT_00108010;
    auVar18 = _DAT_00108020;
    do {
      auVar19 = auVar18 ^ auVar2;
      iVar11 = auVar16._4_4_;
      if ((bool)(~(auVar19._4_4_ == iVar11 && auVar16._0_4_ < auVar19._0_4_ ||
                  iVar11 < auVar19._4_4_) & 1)) {
        piVar1[uVar10] = extraout_EDX_00;
      }
      if ((auVar19._12_4_ != auVar16._12_4_ || auVar19._8_4_ <= auVar16._8_4_) &&
          auVar19._12_4_ <= auVar16._12_4_) {
        piVar1[uVar10 + 1] = extraout_EDX_00;
      }
      auVar19 = auVar17 ^ auVar2;
      iVar20 = auVar19._4_4_;
      if (iVar20 <= iVar11 && (iVar20 != iVar11 || auVar19._0_4_ <= auVar16._0_4_)) {
        piVar1[uVar10 + 2] = extraout_EDX_00;
        piVar1[uVar10 + 3] = extraout_EDX_00;
      }
      uVar10 = uVar10 + 4;
      lVar9 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 4;
      auVar18._8_8_ = lVar9 + 4;
      lVar9 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 4;
      auVar17._8_8_ = lVar9 + 4;
    } while (((ulong)uVar15 + 3 & 0xfffffffffffffffc) != uVar10);
  }
  return;
}

Assistant:

void enlarge_ntuple_list(ntuple_list n_tuple)
{
    /* check parameters */
    if ( n_tuple == NULL || n_tuple->values == NULL || n_tuple->max_size == 0 )
        error("enlarge_ntuple_list: invalid n-tuple.");

    /* duplicate number of tuples */
    n_tuple->max_size *= 2;

    /* realloc memory */
    n_tuple->values = (double *) realloc( (void *) n_tuple->values,
                                          n_tuple->dim * n_tuple->max_size * sizeof(double) );
    if ( n_tuple->values == NULL ) error("not enough memory.");
}